

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O0

char * __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryConditionNoLayeredFBO::getGeometryShaderCode
          (GeometryShaderLayeredRenderingBoundaryConditionNoLayeredFBO *this)

{
  GeometryShaderLayeredRenderingBoundaryConditionNoLayeredFBO *this_local;
  
  return getGeometryShaderCode::result;
}

Assistant:

const char* GeometryShaderLayeredRenderingBoundaryConditionNoLayeredFBO::getGeometryShaderCode()
{
	static const char* result = "${VERSION}\n"
								"\n"
								"${GEOMETRY_SHADER_REQUIRE}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"#define MAX_VERTICES 4\n"
								"\n"
								"layout(points)                                    in;\n"
								"layout(triangle_strip, max_vertices=MAX_VERTICES) out;\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"flat out int layer_id;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    gl_Layer = 1;\n"
								"\n"
								"    layer_id    = gl_Layer;\n"
								"    gl_Position = vec4(1, 1, 0, 1);\n"
								"    EmitVertex();\n"
								"\n"
								"    layer_id    = gl_Layer;\n"
								"    gl_Position = vec4(1, -1, 0, 1);\n"
								"    EmitVertex();\n"
								"\n"
								"    layer_id    = gl_Layer;\n"
								"    gl_Position = vec4(-1, 1, 0, 1);\n"
								"    EmitVertex();\n"
								"\n"
								"    layer_id    = gl_Layer;\n"
								"    gl_Position = vec4(-1, -1, 0, 1);\n"
								"    EmitVertex();\n"
								"\n"
								"    EndPrimitive();\n"
								"}\n";
	return result;
}